

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

re_status_t re_compile(re_context *ctx,char *expr,size_t exprlen,re_machine *result_machine)

{
  int iVar1;
  uint uVar2;
  byte *pbVar3;
  ulong uVar4;
  re_machine *in_RCX;
  ulong in_RDX;
  byte *in_RSI;
  re_context *in_RDI;
  re_machine closure_machine;
  int tmp;
  int ch2;
  int ch;
  uchar set [32];
  int is_exclusive;
  anon_struct_20_3_53c8f05c group_stack [50];
  size_t group_stack_level;
  re_machine new_machine;
  re_machine alter_machine;
  re_machine cur_machine;
  undefined4 in_stack_fffffffffffffb68;
  undefined2 in_stack_fffffffffffffb6c;
  undefined1 in_stack_fffffffffffffb6e;
  char in_stack_fffffffffffffb6f;
  bool bVar5;
  int in_stack_fffffffffffffb70;
  uint in_stack_fffffffffffffb74;
  re_machine *in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  uint local_470;
  uint local_46c;
  byte local_468 [44];
  undefined4 local_43c;
  re_machine local_438 [2];
  int aiStack_428 [248];
  ulong local_48;
  re_machine local_38;
  re_machine local_30;
  re_machine *local_28;
  ulong local_20;
  byte *local_18;
  re_context *local_10;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  re_reset((re_context *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
  re_build_null_machine(local_10,&local_30);
  re_build_null_machine(local_10,&local_38);
  local_48 = 0;
  do {
    if (local_20 == 0) {
      re_alternate_onto((re_context *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                        in_stack_fffffffffffffb78,
                        (re_machine *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70))
      ;
      *local_28 = local_38;
      return RE_STATUS_SUCCESS;
    }
    in_stack_fffffffffffffb80 = (int)(char)*local_18;
    if (in_stack_fffffffffffffb80 == 0x24) {
      if (((1 < local_20) && (local_18[1] != 0x29)) && (local_18[1] != 0x7c)) goto LAB_00282c3f;
      re_build_char((re_context *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffb6f,
                             CONCAT16(in_stack_fffffffffffffb6e,
                                      CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))
                            ),'\0');
      re_concat_onto((re_context *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb78,
                     (re_machine *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      goto LAB_00282da8;
    }
    if (in_stack_fffffffffffffb80 != 0x25) {
      if (in_stack_fffffffffffffb80 != 0x28) {
        if (in_stack_fffffffffffffb80 == 0x29) {
          if (local_48 == 0) goto LAB_00282da8;
          local_48 = local_48 - 1;
          re_alternate_onto((re_context *)CONCAT44(in_stack_fffffffffffffb84,0x29),
                            in_stack_fffffffffffffb78,
                            (re_machine *)
                            CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
          re_build_group((re_context *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80)
                         ,in_stack_fffffffffffffb78,
                         (re_machine *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70)
                         ,CONCAT13(in_stack_fffffffffffffb6f,
                                   CONCAT12(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb6c)));
          local_30 = *(re_machine *)((long)local_438 + local_48 * 0x14);
          local_38 = *(re_machine *)((long)local_438 + local_48 * 0x14 + 8);
        }
        else if (in_stack_fffffffffffffb80 == 0x2e) {
          re_build_char((re_context *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                        (re_machine *)
                        CONCAT17(in_stack_fffffffffffffb6f,
                                 CONCAT16(in_stack_fffffffffffffb6e,
                                          CONCAT24(in_stack_fffffffffffffb6c,
                                                   in_stack_fffffffffffffb68))),'\0');
        }
        else {
          if (in_stack_fffffffffffffb80 != 0x5b) {
            if (in_stack_fffffffffffffb80 == 0x5e) {
              iVar1 = re_is_machine_null(local_10,&local_30);
              if (iVar1 == 0) goto LAB_00282c3f;
              re_build_char((re_context *)
                            CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                            (re_machine *)
                            CONCAT17(in_stack_fffffffffffffb6f,
                                     CONCAT16(in_stack_fffffffffffffb6e,
                                              CONCAT24(in_stack_fffffffffffffb6c,
                                                       in_stack_fffffffffffffb68))),'\0');
              re_concat_onto((re_context *)
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                             in_stack_fffffffffffffb78,
                             (re_machine *)
                             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
            }
            else {
              if (in_stack_fffffffffffffb80 != 0x7c) {
LAB_00282c3f:
                re_build_char((re_context *)
                              CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                              (re_machine *)
                              CONCAT17(in_stack_fffffffffffffb6f,
                                       CONCAT16(in_stack_fffffffffffffb6e,
                                                CONCAT24(in_stack_fffffffffffffb6c,
                                                         in_stack_fffffffffffffb68))),'\0');
                goto LAB_00282c5f;
              }
              re_alternate_onto((re_context *)CONCAT44(in_stack_fffffffffffffb84,0x7c),
                                in_stack_fffffffffffffb78,
                                (re_machine *)
                                CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
              re_build_null_machine(local_10,&local_30);
            }
            goto LAB_00282da8;
          }
          local_43c = 0;
          memset(local_468,0,0x20);
          pbVar3 = local_18;
          uVar4 = local_20;
          local_18 = local_18 + 1;
          local_20 = local_20 - 1;
          if ((local_20 != 0) && (*local_18 == 0x5e)) {
            local_18 = pbVar3 + 2;
            local_20 = uVar4 - 2;
            local_43c = 1;
          }
          if ((local_20 != 0) && (*local_18 == 0x5d)) {
            local_468[0xb] = local_468[0xb] | 0x20;
            local_18 = local_18 + 1;
            local_20 = local_20 - 1;
          }
          if ((local_20 != 0) && (*local_18 == 0x2d)) {
            local_468[5] = local_468[5] | 0x20;
            local_18 = local_18 + 1;
            local_20 = local_20 - 1;
          }
          while( true ) {
            pbVar3 = local_18;
            uVar4 = local_20;
            uVar2 = in_stack_fffffffffffffb74 & 0xffffff;
            if (local_20 != 0) {
              uVar2 = CONCAT13(*local_18 != 0x5d,(int3)in_stack_fffffffffffffb74);
            }
            in_stack_fffffffffffffb74 = uVar2;
            if ((char)(in_stack_fffffffffffffb74 >> 0x18) == '\0') break;
            uVar2 = (uint)*local_18;
            local_468[(int)uVar2 >> 3] = local_468[(int)uVar2 >> 3] | (byte)(1 << (*local_18 & 7));
            local_18 = local_18 + 1;
            local_20 = local_20 - 1;
            if ((local_20 != 0) && (*local_18 == 0x2d)) {
              local_18 = pbVar3 + 2;
              local_20 = uVar4 - 2;
              if (local_20 != 0) {
                local_470 = (uint)*local_18;
                local_18 = pbVar3 + 3;
                local_20 = uVar4 - 3;
                local_46c = uVar2;
                if (local_470 < uVar2) {
                  local_46c = local_470;
                  local_470 = uVar2;
                }
                for (; (int)local_46c <= (int)local_470; local_46c = local_46c + 1) {
                  local_468[(int)local_46c >> 3] =
                       local_468[(int)local_46c >> 3] | (byte)(1 << ((byte)local_46c & 7));
                }
              }
            }
          }
          re_build_char_range((re_context *)
                              CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                              in_stack_fffffffffffffb78,
                              (uchar *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70)
                              ,CONCAT13(in_stack_fffffffffffffb6f,
                                        CONCAT12(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb6c
                                                )));
        }
        goto LAB_00282c5f;
      }
      if (0x32 < local_48) {
        return RE_STATUS_GROUP_NESTING_TOO_DEEP;
      }
      *(re_machine *)((long)local_438 + local_48 * 0x14) = local_30;
      *(re_machine *)((long)local_438 + local_48 * 0x14 + 8) = local_38;
      aiStack_428[local_48 * 5] = local_10->cur_group;
      local_10->cur_group = local_10->cur_group + 1;
      local_48 = local_48 + 1;
      re_build_null_machine(local_10,&local_30);
      re_build_null_machine(local_10,&local_38);
      goto LAB_00282da8;
    }
    pbVar3 = local_18 + 1;
    uVar4 = local_20 - 1;
    if (uVar4 == 0) goto LAB_00282da8;
    in_stack_fffffffffffffb78 = (re_machine *)(ulong)((int)(char)*pbVar3 - 0x31);
    local_20 = uVar4;
    local_18 = pbVar3;
    switch(in_stack_fffffffffffffb78) {
    case (re_machine *)0x0:
    case (re_machine *)0x1:
    case (re_machine *)0x2:
    case (re_machine *)0x3:
    case (re_machine *)0x4:
    case (re_machine *)0x5:
    case (re_machine *)0x6:
    case (re_machine *)0x7:
    case (re_machine *)0x8:
      re_build_group_matcher
                ((re_context *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (re_machine *)
                 CONCAT17(in_stack_fffffffffffffb6f,
                          CONCAT16(in_stack_fffffffffffffb6e,
                                   CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))),0
                );
      goto LAB_00282c5f;
    default:
      re_build_char((re_context *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffb6f,
                             CONCAT16(in_stack_fffffffffffffb6e,
                                      CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))
                            ),'\0');
      goto LAB_00282c5f;
    case (re_machine *)0xb:
      re_build_char((re_context *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffb6f,
                             CONCAT16(in_stack_fffffffffffffb6e,
                                      CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))
                            ),'\0');
      re_concat_onto((re_context *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb78,
                     (re_machine *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      break;
    case (re_machine *)0xd:
      re_build_char((re_context *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffb6f,
                             CONCAT16(in_stack_fffffffffffffb6e,
                                      CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))
                            ),'\0');
      re_concat_onto((re_context *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb78,
                     (re_machine *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      break;
    case (re_machine *)0x11:
      re_build_char((re_context *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffb6f,
                             CONCAT16(in_stack_fffffffffffffb6e,
                                      CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))
                            ),'\0');
      re_concat_onto((re_context *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb78,
                     (re_machine *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      break;
    case (re_machine *)0x26:
      re_build_char((re_context *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffb6f,
                             CONCAT16(in_stack_fffffffffffffb6e,
                                      CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))
                            ),'\0');
      goto LAB_00282c5f;
    case (re_machine *)0x31:
      re_build_char((re_context *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffb6f,
                             CONCAT16(in_stack_fffffffffffffb6e,
                                      CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))
                            ),'\0');
      re_concat_onto((re_context *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb78,
                     (re_machine *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      break;
    case (re_machine *)0x46:
      re_build_char((re_context *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                    (re_machine *)
                    CONCAT17(in_stack_fffffffffffffb6f,
                             CONCAT16(in_stack_fffffffffffffb6e,
                                      CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68))
                            ),'\0');
LAB_00282c5f:
      if ((1 < local_20) &&
         ((in_stack_fffffffffffffb70 = (int)(char)local_18[1], in_stack_fffffffffffffb70 - 0x2aU < 2
          || (in_stack_fffffffffffffb70 == 0x3f)))) {
        local_18 = local_18 + 1;
        local_20 = local_20 - 1;
        re_build_closure((re_context *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80)
                         ,in_stack_fffffffffffffb78,
                         (re_machine *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70)
                         ,in_stack_fffffffffffffb6f);
        while( true ) {
          bVar5 = false;
          if (((1 < local_20) &&
              (in_stack_fffffffffffffb6e = true, bVar5 = (bool)in_stack_fffffffffffffb6e,
              local_18[1] != 0x3f)) &&
             (in_stack_fffffffffffffb6e = true, bVar5 = (bool)in_stack_fffffffffffffb6e,
             local_18[1] != 0x2b)) {
            in_stack_fffffffffffffb6e = local_18[1] == 0x2a;
            bVar5 = (bool)in_stack_fffffffffffffb6e;
          }
          if (bVar5 == false) break;
          local_18 = local_18 + 1;
          local_20 = local_20 - 1;
        }
        in_stack_fffffffffffffb6f = '\0';
      }
      re_concat_onto((re_context *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb78,
                     (re_machine *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
    }
LAB_00282da8:
    local_18 = local_18 + 1;
    local_20 = local_20 - 1;
  } while( true );
}

Assistant:

static re_status_t re_compile(re_context *ctx,
                              const char *expr, size_t exprlen,
                              re_machine *result_machine)
{
    re_machine cur_machine;
    re_machine alter_machine;
    re_machine new_machine;
    size_t group_stack_level;
    struct
    {
        re_machine old_cur;
        re_machine old_alter;
        int group_id;
    } group_stack[50];

    /* reset everything */
    re_reset(ctx);

    /* start out with no current machine and no alternate machine */
    re_build_null_machine(ctx, &cur_machine);
    re_build_null_machine(ctx, &alter_machine);

    /* nothing on the stack yet */
    group_stack_level = 0;

    /* loop until we run out of expression to parse */
    for ( ; exprlen != 0 ; ++expr, --exprlen)
    {
        switch(*expr)
        {
        case '^':
            /*
             *   beginning of line - if we're not at the beginning of the
             *   current expression (i.e., we already have some
             *   concatentations accumulated), treat it as an ordinary
             *   character 
             */
            if (!re_is_machine_null(ctx, &cur_machine))
                goto normal_char;

            /* build a new start-of-text recognizer */
            re_build_char(ctx, &new_machine, RE_TEXT_BEGIN);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;

        case '$':
            /*
             *   End of line specifier - if there's anything left after
             *   the '$' other than a close parens or alternation
             *   specifier, great it as a normal character 
             */
            if (exprlen > 1
                && (*(expr+1) != ')' && *(expr+1) != '|'))
                goto normal_char;

            /* build a new end-of-text recognizer */
            re_build_char(ctx, &new_machine, RE_TEXT_END);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;
            
        case '(':
            /* 
             *   Add a nesting level.  Push the current machine and
             *   alternate machines onto the group stack, and clear
             *   everything out for the new group. 
             */
            if (group_stack_level
                > sizeof(group_stack)/sizeof(group_stack[0]))
            {
                /* we cannot proceed - return an error */
                return RE_STATUS_GROUP_NESTING_TOO_DEEP;
            }

            /* save the current state on the stack */
            group_stack[group_stack_level].old_cur = cur_machine;
            group_stack[group_stack_level].old_alter = alter_machine;

            /* 
             *   Assign the group a group ID - groups are numbered in
             *   order of their opening (left) parentheses, so we want to
             *   assign a group number now.  We won't actually need to
             *   know the group number until we get to the matching close
             *   paren, but we need to assign it now, so store it in the
             *   group stack. 
             */
            group_stack[group_stack_level].group_id = ctx->cur_group;

            /* consume the group number */
            ctx->cur_group++;

            /* push the level */
            ++group_stack_level;

            /* start the new group with empty machines */
            re_build_null_machine(ctx, &cur_machine);
            re_build_null_machine(ctx, &alter_machine);
            break;

        case ')':
            /* if there's nothing on the stack, ignore this */
            if (group_stack_level == 0)
                break;

            /* take a level off the stack */
            --group_stack_level;

            /* 
             *   Remove a nesting level.  If we have a pending alternate
             *   expression, build the alternation expression.  This will
             *   leave the entire group expression in alter_machine,
             *   regardless of whether an alternation was in progress or
             *   not.  
             */
            re_alternate_onto(ctx, &alter_machine, &cur_machine);

            /*
             *   Create a group machine that encloses the group and marks
             *   it with a group number.  We assigned the group number
             *   when we parsed the open paren, so read that group number
             *   from the stack.
             *   
             *   Note that this will leave 'new_machine' with the entire
             *   group machine.  
             */
            re_build_group(ctx, &new_machine, &alter_machine,
                           group_stack[group_stack_level].group_id);

            /*
             *   Pop the stack - restore the alternation and current
             *   machines that were in progress before the group started. 
             */
            cur_machine = group_stack[group_stack_level].old_cur;
            alter_machine = group_stack[group_stack_level].old_alter;

            /*
             *   Check the group expression (in new_machine) for postfix
             *   expressions 
             */
            goto apply_postfix;

        case '|':
            /* 
             *   Start a new alternation.  This ends the current
             *   alternation; if we have a previous pending alternate,
             *   build an alternation machine out of the previous
             *   alternate and the current machine and move that to the
             *   alternate; otherwise, simply move the current machine to
             *   the pending alternate. 
             */
            re_alternate_onto(ctx, &alter_machine, &cur_machine);

            /* 
             *   the alternation starts out with a blank slate, so null
             *   out the current machine 
             */
            re_build_null_machine(ctx, &cur_machine);
            break;

        case '%':
            /* 
             *   quoted character - skip the quote mark and see what we
             *   have 
             */
            ++expr;
            --exprlen;

            /* check to see if we're at the end of the expression */
            if (exprlen == 0)
            {
                /* 
                 *   end of the string - ignore it, but undo the extra
                 *   increment of the expression index so that we exit the
                 *   enclosing loop properly 
                 */
                --expr;
                ++exprlen;
                break;
            }

            /* see what we have */
            switch(*expr)
            {
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                /* group match - build a new literal group recognizer */
                re_build_group_matcher(ctx, &new_machine, (int)(*expr - '1'));

                /* apply any postfix expression to the group recognizer */
                goto apply_postfix;

            case '<':
                /* build a beginning-of-word recognizer */
                re_build_char(ctx, &new_machine, RE_WORD_BEGIN);

                /* it can't be postfixed - just concatenate it */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case '>':
                /* build an end-of-word recognizer */
                re_build_char(ctx, &new_machine, RE_WORD_END);

                /* it can't be postfixed - just concatenate it */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case 'w':
                /* word character */
                re_build_char(ctx, &new_machine, RE_WORD_CHAR);
                goto apply_postfix;

            case 'W':
                /* non-word character */
                re_build_char(ctx, &new_machine, RE_NON_WORD_CHAR);
                goto apply_postfix;

            case 'b':
                /* word boundary */
                re_build_char(ctx, &new_machine, RE_WORD_BOUNDARY);

                /* it can't be postfixed */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case 'B':
                /* not a word boundary */
                re_build_char(ctx, &new_machine, RE_NON_WORD_BOUNDARY);

                /* it can't be postfixed */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            default:
                /* build a new literal character recognizer */
                re_build_char(ctx, &new_machine, *expr);

                /* apply any postfix expression to the character */
                goto apply_postfix;
            }
            break;

        case '.':
            /* 
             *   wildcard character - build a single character recognizer
             *   for the special wildcard symbol, then go check it for a
             *   postfix operator 
             */
            re_build_char(ctx, &new_machine, RE_WILDCARD);
            goto apply_postfix;
            break;

        case '[':
            /* range expression */
            {
                int is_exclusive = FALSE;
                unsigned char set[32];

                /* clear out the set of characters in the range */
                memset(set, 0, sizeof(set));

                /* first, skip the open bracket */
                ++expr;
                --exprlen;

                /* check to see if starts with the exclusion character */
                if (exprlen != 0 && *expr == '^')
                {
                    /* skip the exclusion specifier */
                    ++expr;
                    --exprlen;

                    /* note it */
                    is_exclusive = TRUE;
                }

                /* 
                 *   if the first character is a ']', include it in the
                 *   range 
                 */
                if (exprlen != 0 && *expr == ']')
                {
                    re_set_bit(set, (int)']');
                    ++expr;
                    --exprlen;
                }

                /*
                 *   if the next character is a '-', include it in the
                 *   range 
                 */
                if (exprlen != 0 && *expr == '-')
                {
                    re_set_bit(set, (int)'-');
                    ++expr;
                    --exprlen;
                }

                /* scan the character set */
                while (exprlen != 0 && *expr != ']')
                {
                    int ch;
                    
                    /* note this character */
                    ch = (int)(unsigned char)*expr;

                    /* set it */
                    re_set_bit(set, ch);

                    /* skip this character of the expression */
                    ++expr;
                    --exprlen;

                    /* check for a range */
                    if (exprlen != 0 && *expr == '-')
                    {
                        int ch2;
                        
                        /* skip the '-' */
                        ++expr;
                        --exprlen;
                        if (exprlen != 0)
                        {
                            /* get the other end of the range */
                            ch2 = (int)(unsigned char)*expr;

                            /* skip the second character */
                            ++expr;
                            --exprlen;

                            /* if the range is reversed, swap it */
                            if (ch > ch2)
                            {
                                int tmp = ch;
                                ch = ch2;
                                ch2 = tmp;
                            }

                            /* fill in the range */
                            for ( ; ch <= ch2 ; ++ch)
                                re_set_bit(set, ch);
                        }
                    }
                }

                /* create a character range machine */
                re_build_char_range(ctx, &new_machine, set, is_exclusive);

                /* apply any postfix operator */
                goto apply_postfix;
            }            
            break;

        default:
        normal_char:
            /* 
             *   it's an ordinary character - build a single character
             *   recognizer machine, and then concatenate it onto any
             *   existing machine 
             */
            re_build_char(ctx, &new_machine, *expr);

        apply_postfix:
            /*
             *   Check for a postfix operator, and apply it to the machine
             *   in 'new_machine' if present.  In any case, concatenate
             *   the 'new_machine' (modified by a postix operator or not)
             *   to the current machien.  
             */
            if (exprlen > 1)
            {
                switch(*(expr+1))
                {
                case '*':
                case '+':
                case '?':
                    /*
                     *   We have a postfix closure operator.  Build a new
                     *   closure machine out of 'new_machine'.  
                     */
                    {
                        re_machine closure_machine;
                        
                        /* move onto the closure operator */
                        ++expr;
                        --exprlen;
                        
                        /* build the closure machine */
                        re_build_closure(ctx, &closure_machine,
                                         &new_machine, *expr);
                        
                        /* replace the original machine with the closure */
                        new_machine = closure_machine;
                        
                        /* 
                         *   skip any redundant closure symbols, keeping
                         *   only the first one we saw 
                         */
                        while (exprlen > 1 && (*(expr+1) == '?'
                                               || *(expr+1) == '+'
                                               || *(expr+1) == '*'))
                        {
                            ++expr;
                            --exprlen;
                        }
                    }
                    break;
                    
                default:
                    /* no postfix operator */
                    break;
                }
            }

            /*
             *   Concatenate the new machine onto the current machine
             *   under construction.  
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;
        }
    }

    /* complete any pending alternation */
    re_alternate_onto(ctx, &alter_machine, &cur_machine);

    /* store the resulting machine in the caller's machine descriptor */
    *result_machine = alter_machine;

    /* no errors encountered */
    return RE_STATUS_SUCCESS;
}